

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O0

void AssemblyCode::colorToRegisterChange
               (CTemp *temp,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *tempToColorMap,RegisterInfo *registerInfo)

{
  bool bVar1;
  _Base_ptr this;
  pointer ppVar2;
  reference string;
  _Self local_60 [3];
  key_type local_48 [32];
  _Self local_28;
  iterator mapEntry;
  RegisterInfo *registerInfo_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *tempToColorMap_local;
  CTemp *temp_local;
  
  totalAllocated = 0;
  mapEntry._M_node = (_Base_ptr)registerInfo;
  IRT::CTemp::ToString_abi_cxx11_((CTemp *)local_48);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(tempToColorMap,local_48);
  std::__cxx11::string::~string((string *)local_48);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(tempToColorMap);
  bVar1 = std::operator!=(&local_28,local_60);
  if (bVar1) {
    this = mapEntry._M_node + 2;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_28);
    string = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this,(long)ppVar2->second);
    IRT::CTemp::setName(temp,string);
  }
  return;
}

Assistant:

void AssemblyCode::colorToRegisterChange( IRT::CTemp& temp,
                            std::map<std::string, int> &tempToColorMap, AssemblyCode::RegisterInfo &registerInfo ) {
    totalAllocated = 0;
    auto mapEntry = tempToColorMap.find(temp.ToString());
    if (mapEntry != tempToColorMap.end()) {
        temp.setName(registerInfo.registers[mapEntry->second]);
    }
}